

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O2

QList<unsigned_int> * __thiscall
QRawFont::glyphIndexesForString
          (QList<unsigned_int> *__return_storage_ptr__,QRawFont *this,QString *text)

{
  long lVar1;
  QFontEngine *pQVar2;
  int iVar3;
  char16_t *pcVar4;
  long in_FS_OFFSET;
  int numGlyphs;
  undefined1 *local_58;
  pointer puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  int iStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (uint *)0x0;
  if ((((this->d).d.ptr)->fontEngine != (QFontEngine *)0x0) && (lVar1 = (text->d).size, lVar1 != 0))
  {
    iVar3 = (int)lVar1;
    numGlyphs = iVar3;
    QList<unsigned_int>::resize(__return_storage_ptr__,(long)iVar3);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = (pointer)&DAT_aaaaaaaaaaaaaaaa;
    _iStack_30 = CONCAT44(0xaaaaaaaa,iVar3);
    puStack_50 = QList<unsigned_int>::data(__return_storage_ptr__);
    pQVar2 = ((this->d).d.ptr)->fontEngine;
    pcVar4 = (text->d).ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    (*pQVar2->_vptr_QFontEngine[0xc])
              (pQVar2,pcVar4,(ulong)(uint)(text->d).size,&local_58,&numGlyphs,4);
    QList<unsigned_int>::resize(__return_storage_ptr__,(long)numGlyphs);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<quint32> QRawFont::glyphIndexesForString(const QString &text) const
{
    QList<quint32> glyphIndexes;
    if (!d->isValid() || text.isEmpty())
        return glyphIndexes;

    int numGlyphs = text.size();
    glyphIndexes.resize(numGlyphs);

    QGlyphLayout glyphs;
    glyphs.numGlyphs = numGlyphs;
    glyphs.glyphs = glyphIndexes.data();
    if (d->fontEngine->stringToCMap(text.data(), text.size(), &glyphs, &numGlyphs, QFontEngine::GlyphIndicesOnly) < 0)
        Q_UNREACHABLE();

    glyphIndexes.resize(numGlyphs);
    return glyphIndexes;
}